

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O3

time_point __thiscall
spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>::
next_rotation_tp_(daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  time_t tVar4;
  time_point tVar5;
  duration dVar6;
  time_t tnow;
  long local_58;
  tm local_50;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  local_58 = lVar3 / 1000000000;
  details::os::localtime((os *)&local_50,&local_58);
  uVar1 = this->rotation_h_;
  uVar2 = this->rotation_m_;
  local_50.tm_hour = uVar1;
  local_50.tm_min = uVar2;
  local_50.tm_sec = 0;
  tVar4 = mktime(&local_50);
  dVar6.__r = tVar4 * 1000000000;
  tVar5.__d.__r = (duration)(duration)(dVar6.__r + 86400000000000);
  if (SBORROW8(lVar3,dVar6.__r) != lVar3 + tVar4 * -1000000000 < 0) {
    tVar5.__d.__r = (duration)(duration)dVar6.__r;
  }
  return (time_point)tVar5.__d.__r;
}

Assistant:

log_clock::time_point next_rotation_tp_()
    {
        auto now = log_clock::now();
        tm date = now_tm(now);
        date.tm_hour = rotation_h_;
        date.tm_min = rotation_m_;
        date.tm_sec = 0;
        auto rotation_time = log_clock::from_time_t(std::mktime(&date));
        if (rotation_time > now)
        {
            return rotation_time;
        }
        return {rotation_time + std::chrono::hours(24)};
    }